

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.h
# Opt level: O1

value_type __thiscall SL::WS_LITE::HubContext::getnextContext(HubContext *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulong uVar2;
  ulong uVar3;
  pointer psVar4;
  ulong *in_RSI;
  value_type vVar5;
  
  LOCK();
  uVar2 = *in_RSI;
  *in_RSI = *in_RSI + 1;
  UNLOCK();
  uVar3 = in_RSI[1];
  vVar5.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((uVar2 % (ulong)((long)(in_RSI[2] - uVar3) >> 4)) * 0x10);
  (this->m_nextService).super___atomic_base<unsigned_long>._M_i =
       *(__int_type *)
        ((long)&(vVar5.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3);
  psVar4 = *(pointer *)
            ((long)&(vVar5.
                     super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count + uVar3);
  (this->ThreadContexts).
  super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar4;
  if (psVar4 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(psVar4->super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &(psVar4->super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  vVar5.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_type)
         vVar5.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto getnextContext() { return ThreadContexts[(m_nextService++ % ThreadContexts.size())]; }